

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  uint64_t id;
  Schema local_148;
  Schema local_140;
  uint local_134;
  undefined1 local_130 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Reader local_a0;
  undefined1 local_70 [8];
  Reader superclasses;
  Fault local_30;
  Fault f;
  uint *counter_local;
  InterfaceSchema *this_local;
  InterfaceSchema other_local;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  f.exception = (Exception *)counter;
  this_local = (InterfaceSchema *)other.super_Schema.raw;
  if (uVar1 < 0x40) {
    bVar2 = Schema::operator==((Schema *)&this_local,&this->super_Schema);
    if (bVar2) {
      other_local.super_Schema.raw._7_1_ = 1;
    }
    else {
      Schema::getProto((Reader *)&__range1,&this->super_Schema);
      capnp::schema::Node::Reader::getInterface(&local_a0,(Reader *)&__range1);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_70,&local_a0);
      ___begin1 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                            ((Reader *)local_70);
      __end1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
      while( true ) {
        bVar2 = kj::Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i);
        if (!bVar2) break;
        puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
        superclass._reader._40_8_ = *puVar3;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_130,(Reader *)local_70,(uint)superclass._reader._40_8_);
        local_134 = capnp::_::RawBrandedSchema::makeDepLocation
                              (SUPERCLASS,superclass._reader.nestingLimit);
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_130);
        local_148 = Schema::getDependency(&this->super_Schema,id,local_134);
        local_140.raw = (RawBrandedSchema *)Schema::asInterface(&local_148);
        bVar2 = extends((InterfaceSchema *)&local_140,(InterfaceSchema)this_local,
                        (uint *)f.exception);
        if (bVar2) {
          other_local.super_Schema.raw._7_1_ = 1;
          goto LAB_0080d55c;
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end1);
      }
      other_local.super_Schema.raw._7_1_ = 0;
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x267,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    other_local.super_Schema.raw._7_1_ = 0;
    kj::_::Debug::Fault::~Fault(&local_30);
  }
LAB_0080d55c:
  return (bool)(other_local.super_Schema.raw._7_1_ & 1);
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}